

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iobase.cpp
# Opt level: O0

void __thiscall CIOOutputFile::next(CIOOutputFile *this,uint8_t *ptr,uint32_t length)

{
  size_t sVar1;
  undefined8 uVar2;
  int result;
  uint32_t length_local;
  uint8_t *ptr_local;
  CIOOutputFile *this_local;
  
  if ((this->m_fp != (FILE *)0x0) &&
     (sVar1 = fwrite(ptr,(ulong)length,1,(FILE *)this->m_fp), (int)sVar1 != 1)) {
    (*(this->super_CIOBaseWrite).super_CIOBase._vptr_CIOBase[3])();
    CIOBase::parameters((CIOBase *)this);
    uVar2 = std::__cxx11::string::c_str();
    printf("I could not write to %s.\n",uVar2);
  }
  return;
}

Assistant:

void CIOOutputFile::next(const uint8_t* ptr, uint32_t length) {
    if ( m_fp ) {
        int result = fwrite(ptr, length, 1, m_fp);
        if ( result != 1) {
            stop();
            printf("I could not write to %s.\n", parameters().m_filename.c_str());            
        }
    }
}